

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Message::GetOption
          (Error *__return_storage_ptr__,Message *this,ByteArray *aValue,OptionType aNumber)

{
  OptionValue *__x;
  char *begin;
  char *pcVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  OptionType aNumber_local;
  string local_90;
  undefined1 local_70 [40];
  OptionType *local_48;
  code *local_40;
  size_t local_38;
  undefined8 local_30;
  format_string_checker<char> *local_28;
  code *local_20;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  aNumber_local = aNumber;
  __x = GetOption(this,aNumber);
  if (__x == (OptionValue *)0x0) {
    local_48 = (OptionType *)CONCAT44(local_48._4_4_,custom_type);
    local_40 = (code *)0x1fcba3;
    local_38 = 0x18;
    local_30._0_4_ = 0;
    local_30._4_4_ = 1;
    local_20 = ::fmt::v10::detail::
               parse_format_specs<ot::commissioner::coap::OptionType,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar1 = "CoAP option {} not found";
    local_28 = (format_string_checker<char> *)&local_48;
    while (begin = pcVar1, begin != "") {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,ot::commissioner::coap::OptionType>&>
                           (begin,"",(format_string_checker<char> *)&local_48);
      }
    }
    local_48 = &aNumber_local;
    local_40 = ::fmt::v10::detail::value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
               format_custom_arg<ot::commissioner::coap::OptionType,fmt::v10::formatter<ot::commissioner::coap::OptionType,char,void>>
    ;
    fmt.size_ = 0xf;
    fmt.data_ = (char *)0x18;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_48;
    ::fmt::v10::vformat_abi_cxx11_(&local_90,(v10 *)"CoAP option {} not found",fmt,args);
    local_70._0_4_ = kNotFound;
    std::__cxx11::string::string((string *)(local_70 + 8),(string *)&local_90);
    Error::operator=(__return_storage_ptr__,(Error *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 8));
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(aValue,&__x->mValue);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetOption(ByteArray &aValue, OptionType aNumber) const
{
    Error error;
    auto  option = GetOption(aNumber);

    VerifyOrExit(option != nullptr, error = ERROR_NOT_FOUND("CoAP option {} not found", aNumber));

    aValue = option->GetOpaqueValue();

exit:
    return error;
}